

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

void __thiscall BCLog::Logger::DisableLogging(Logger *this)

{
  long lVar1;
  bool bVar2;
  long in_RDI;
  long in_FS_OFFSET;
  StdLockGuard scoped_lock;
  Logger *in_stack_000000a8;
  list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
  *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  StdLockGuard::StdLockGuard((StdLockGuard *)in_stack_ffffffffffffffd8,(StdMutex *)0xfe7abf);
  if ((*(byte *)(in_RDI + 0x48) & 1) == 0) {
    __assert_fail("m_buffering",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                  ,0x70,"void BCLog::Logger::DisableLogging()");
  }
  bVar2 = std::__cxx11::
          list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
          ::empty(in_stack_ffffffffffffffd8);
  if (!bVar2) {
    __assert_fail("m_print_callbacks.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                  ,0x71,"void BCLog::Logger::DisableLogging()");
  }
  StdLockGuard::~StdLockGuard((StdLockGuard *)in_stack_ffffffffffffffd8);
  *(undefined1 *)(in_RDI + 0xd1) = 0;
  *(undefined1 *)(in_RDI + 0xd0) = 0;
  StartLogging(in_stack_000000a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BCLog::Logger::DisableLogging()
{
    {
        StdLockGuard scoped_lock(m_cs);
        assert(m_buffering);
        assert(m_print_callbacks.empty());
    }
    m_print_to_file = false;
    m_print_to_console = false;
    StartLogging();
}